

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

void __thiscall imrt::Station::generateIntensity(Station *this)

{
  int iVar1;
  pair<int,_int> pVar2;
  long lVar3;
  int a;
  long lVar4;
  int i;
  long lVar5;
  int j;
  long lVar6;
  
  clearIntensity(this);
  for (lVar4 = 0; lVar4 < this->max_apertures; lVar4 = lVar4 + 1) {
    for (lVar5 = 0; iVar1 = Collimator::getXdim(this->collimator), lVar5 < iVar1; lVar5 = lVar5 + 1)
    {
      pVar2 = Collimator::getActiveRange(this->collimator,(int)lVar5,this->angle);
      if (-1 < pVar2.first) {
        lVar3 = *(long *)&(this->A).
                          super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar4].
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data;
        lVar6 = (long)*(int *)(lVar3 + lVar5 * 8);
        if (-1 < lVar6) {
          for (; (int)lVar6 <= *(int *)(lVar3 + 4 + lVar5 * 8); lVar6 = lVar6 + 1) {
            change_intensity(this,(int)lVar5,(int)lVar6,
                             (this->I).p[lVar5][lVar6] +
                             (this->intensity).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar4],
                             (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              *)0x0);
            lVar3 = *(long *)&(this->A).
                              super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar4].
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Station::generateIntensity(){
    pair <int,int>aux;
    clearIntensity();
    //printIntensity();
    for (int a=0 ; a<max_apertures; a++) {
      for (int i=0; i < collimator.getXdim(); i++) {
        aux = collimator.getActiveRange(i,angle);
        if (aux.first<0 || A[a][i].first<0) continue;
        //for (int j=aux.first; j<=aux.second; j++) {
        for (int j=A[a][i].first; j<=A[a][i].second; j++) {
          //if (j>=A[a][i].first && j<=A[a][i].second){
            //cout << "a:" <<a << " i:" << i << " j:" <<j << " to add:" <<  intensity[a] << " on:" << I(i,j) <<  endl;
            change_intensity(i, j, I(i,j)+intensity[a]);
          //}
        }
      }
    }
  }